

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_invalid_flags(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  char *pcVar3;
  sockaddr_in addr;
  uv_tcp_t server;
  undefined1 auStack_450 [16];
  undefined1 auStack_440 [16];
  char acStack_430 [248];
  char acStack_338 [80];
  char acStack_2e8 [192];
  code *pcStack_228;
  undefined1 auStack_218 [248];
  code *pcStack_120;
  undefined1 local_110 [16];
  undefined1 local_100 [248];
  
  pcStack_120 = (code *)0x170435;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_110);
  if (iVar1 == 0) {
    pcStack_120 = (code *)0x17043e;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x17044b;
    iVar1 = uv_tcp_init(uVar2,local_100);
    if (iVar1 != 0) goto LAB_001704ac;
    pcStack_120 = (code *)0x170463;
    iVar1 = uv_tcp_bind(local_100,local_110,1);
    if (iVar1 != -0x16) goto LAB_001704b1;
    pcStack_120 = (code *)0x17046d;
    unaff_RBX = uv_default_loop();
    pcStack_120 = (code *)0x170481;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_120 = (code *)0x17048b;
    uv_run(unaff_RBX,0);
    pcStack_120 = (code *)0x170490;
    uVar2 = uv_default_loop();
    pcStack_120 = (code *)0x170498;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x1704ac;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_001704ac:
    pcStack_120 = (code *)0x1704b1;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_001704b1:
    pcStack_120 = (code *)0x1704b6;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  pcStack_120 = run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pcStack_228 = (code *)0x1704c8;
  pcStack_120 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_228 = (code *)0x1704d5;
  iVar1 = uv_tcp_init(uVar2,auStack_218);
  if (iVar1 == 0) {
    pcStack_228 = (code *)0x1704ea;
    iVar1 = uv_listen(auStack_218,0x80,0);
    if (iVar1 != 0) goto LAB_00170532;
    pcStack_228 = (code *)0x1704f3;
    unaff_RBX = uv_default_loop();
    pcStack_228 = (code *)0x170507;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_228 = (code *)0x170511;
    uv_run(unaff_RBX,0);
    pcStack_228 = (code *)0x170516;
    uVar2 = uv_default_loop();
    pcStack_228 = (code *)0x17051e;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_228 = (code *)0x170532;
    run_test_tcp_listen_without_bind_cold_1();
LAB_00170532:
    pcStack_228 = (code *)0x170537;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pcStack_228 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  pcVar3 = "0.0.0.0";
  pcStack_228 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_450);
  if (iVar1 == 0) {
    pcVar3 = (char *)uv_default_loop();
    iVar1 = uv_tcp_init(pcVar3,acStack_430);
    if (iVar1 != 0) goto LAB_001706b6;
    pcVar3 = acStack_430;
    iVar1 = uv_tcp_bind(pcVar3,auStack_450,0);
    if (iVar1 != 0) goto LAB_001706bb;
    pcVar3 = acStack_430;
    iVar1 = uv_listen(pcVar3,0x80,0);
    if (iVar1 != 0) goto LAB_001706c0;
    pcVar3 = acStack_430;
    iVar1 = uv_is_writable(pcVar3);
    if (iVar1 != 0) goto LAB_001706c5;
    pcVar3 = acStack_430;
    iVar1 = uv_is_readable(pcVar3);
    if (iVar1 != 0) goto LAB_001706ca;
    auStack_440 = uv_buf_init("PING",4);
    pcVar3 = acStack_2e8;
    iVar1 = uv_write(pcVar3,acStack_430,auStack_440,1,0);
    if (iVar1 != -0x20) goto LAB_001706cf;
    pcVar3 = acStack_338;
    iVar1 = uv_shutdown(pcVar3,acStack_430,0);
    if (iVar1 != -0x6b) goto LAB_001706d4;
    pcVar3 = acStack_430;
    iVar1 = uv_read_start(pcVar3,0,0);
    if (iVar1 != -0x6b) goto LAB_001706d9;
    uv_close(acStack_430,close_cb);
    pcVar3 = (char *)uv_default_loop();
    uv_run(pcVar3,0);
    if (close_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar3 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001706e3;
    }
  }
  else {
    run_test_tcp_bind_writable_flags_cold_1();
LAB_001706b6:
    run_test_tcp_bind_writable_flags_cold_2();
LAB_001706bb:
    run_test_tcp_bind_writable_flags_cold_3();
LAB_001706c0:
    run_test_tcp_bind_writable_flags_cold_4();
LAB_001706c5:
    run_test_tcp_bind_writable_flags_cold_5();
LAB_001706ca:
    run_test_tcp_bind_writable_flags_cold_6();
LAB_001706cf:
    run_test_tcp_bind_writable_flags_cold_7();
LAB_001706d4:
    run_test_tcp_bind_writable_flags_cold_8();
LAB_001706d9:
    run_test_tcp_bind_writable_flags_cold_9();
  }
  run_test_tcp_bind_writable_flags_cold_10();
LAB_001706e3:
  run_test_tcp_bind_writable_flags_cold_11();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_invalid_flags) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, UV_TCP_IPV6ONLY);
  ASSERT(r == UV_EINVAL);

  MAKE_VALGRIND_HAPPY();
  return 0;
}